

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

void Ssw_RarTransferPatterns(Ssw_RarMan_t *p,Vec_Int_t *vInits)

{
  double dVar1;
  double *pdVar2;
  word *pwVar3;
  byte bVar4;
  char *__function;
  int iVar5;
  ulong uVar6;
  long lVar7;
  char *__assertion;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  double dVar11;
  
  Ssw_RarTranspose(p);
  iVar10 = 0;
  do {
    iVar5 = p->pPars->nWords;
    if (iVar5 * 0x40 <= iVar10) {
      lVar7 = 0;
      do {
        if (iVar5 << 6 <= lVar7) {
          vInits->nSize = 0;
          iVar10 = 0;
          while( true ) {
            if (iVar5 <= iVar10) {
              if (vInits->nSize == iVar5 * p->pAig->nRegs) {
                return;
              }
              __assert_fail("Vec_IntSize(vInits) == Aig_ManRegNum(p->pAig) * p->pPars->nWords",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                            ,0x367,"void Ssw_RarTransferPatterns(Ssw_RarMan_t *, Vec_Int_t *)");
            }
            uVar6 = 0xffffffffffffffff;
            dVar11 = -1000000000.0;
            for (uVar8 = 0; (uint)(iVar5 << 6) != uVar8; uVar8 = uVar8 + 1) {
              dVar1 = p->pPatCosts[uVar8];
              if (dVar11 < dVar1) {
                uVar6 = uVar8;
              }
              uVar6 = uVar6 & 0xffffffff;
              if (dVar1 <= dVar11) {
                dVar1 = dVar11;
              }
              dVar11 = dVar1;
            }
            iVar5 = (int)uVar6;
            if (iVar5 < 0) break;
            p->pPatCosts[uVar6 & 0xffffffff] = -1000000000.0;
            pwVar3 = Ssw_RarPatSim(p,iVar5);
            uVar6 = 0;
            while (uVar9 = (uint)uVar6, (int)uVar9 < p->pAig->nRegs) {
              Vec_IntPush(vInits,(uint)((*(uint *)((long)pwVar3 + (uVar6 >> 5) * 4) >>
                                         (uVar9 & 0x1f) & 1) != 0));
              uVar6 = (ulong)(uVar9 + 1);
            }
            Vec_IntPush(p->vPatBests,iVar5);
            iVar10 = iVar10 + 1;
            iVar5 = p->pPars->nWords;
          }
          __assert_fail("iPatBest >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                        ,0x35e,"void Ssw_RarTransferPatterns(Ssw_RarMan_t *, Vec_Int_t *)");
        }
        pwVar3 = Ssw_RarPatSim(p,(int)lVar7);
        pdVar2 = p->pPatCosts;
        pdVar2[lVar7] = 0.0;
        uVar6 = (ulong)(uint)p->nGroups;
        if (p->nGroups < 1) {
          uVar6 = 0;
        }
        dVar11 = 0.0;
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          iVar10 = p->pPars->nBinSize;
          if ((long)(p->pAig->nRegs / iVar10) <= (long)uVar8) {
            __assertion = "iBin >= 0 && iBin < Aig_ManRegNum(p->pAig) / p->pPars->nBinSize";
            __function = "int Ssw_RarGetBinPat(Ssw_RarMan_t *, int, int)";
            uVar9 = 0x40;
            goto LAB_004edd83;
          }
          bVar4 = (byte)iVar10;
          if (1 << (bVar4 & 0x1f) <= (int)(uint)*(byte *)((long)pwVar3 + uVar8)) {
            __assertion = "iPat >= 0 && iPat < (1 << p->pPars->nBinSize)";
            __function = "int Ssw_RarGetBinPat(Ssw_RarMan_t *, int, int)";
            uVar9 = 0x41;
            goto LAB_004edd83;
          }
          iVar10 = p->pRarity
                   [((int)uVar8 << (bVar4 & 0x1f)) + (uint)*(byte *)((long)pwVar3 + uVar8)];
          if (iVar10 < 1) {
            __assert_fail("Value > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                          ,0x349,"void Ssw_RarTransferPatterns(Ssw_RarMan_t *, Vec_Int_t *)");
          }
          dVar11 = dVar11 + 1.0 / (double)(iVar10 * iVar10);
          pdVar2[lVar7] = dVar11;
        }
        lVar7 = lVar7 + 1;
        iVar5 = p->pPars->nWords;
      } while( true );
    }
    pwVar3 = Ssw_RarPatSim(p,iVar10);
    for (lVar7 = 0; lVar7 < p->nGroups; lVar7 = lVar7 + 1) {
      iVar5 = p->pPars->nBinSize;
      if (p->pAig->nRegs / iVar5 <= lVar7) {
        __assertion = "iBin >= 0 && iBin < Aig_ManRegNum(p->pAig) / p->pPars->nBinSize";
        __function = "void Ssw_RarAddToBinPat(Ssw_RarMan_t *, int, int)";
        uVar9 = 0x4c;
LAB_004edd83:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                      ,uVar9,__function);
      }
      bVar4 = (byte)iVar5;
      if (1 << (bVar4 & 0x1f) <= (int)(uint)*(byte *)((long)pwVar3 + lVar7)) {
        __assertion = "iPat >= 0 && iPat < (1 << p->pPars->nBinSize)";
        __function = "void Ssw_RarAddToBinPat(Ssw_RarMan_t *, int, int)";
        uVar9 = 0x4d;
        goto LAB_004edd83;
      }
      p->pRarity[((int)lVar7 << (bVar4 & 0x1f)) + (uint)*(byte *)((long)pwVar3 + lVar7)] =
           p->pRarity[((int)lVar7 << (bVar4 & 0x1f)) + (uint)*(byte *)((long)pwVar3 + lVar7)] + 1;
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

static void Ssw_RarTransferPatterns( Ssw_RarMan_t * p, Vec_Int_t * vInits )
{
//    Aig_Obj_t * pObj;
    unsigned char * pData;
    unsigned * pPattern;
    int i, k, Value;

    // more data from regs to pats
    Ssw_RarTranspose( p );

    // update counters
    for ( k = 0; k < p->pPars->nWords * 64; k++ )
    {
        pData = (unsigned char *)Ssw_RarPatSim( p, k );
        for ( i = 0; i < p->nGroups; i++ )
            Ssw_RarAddToBinPat( p, i, pData[i] );
    }

    // for each pattern
    for ( k = 0; k < p->pPars->nWords * 64; k++ )
    {
        pData = (unsigned char *)Ssw_RarPatSim( p, k );
        // find the cost of its values
        p->pPatCosts[k] = 0.0;
        for ( i = 0; i < p->nGroups; i++ )
        {
            Value = Ssw_RarGetBinPat( p, i, pData[i] );
            assert( Value > 0 );
            p->pPatCosts[k] += 1.0/(Value*Value);
        }
        // print the result
//Abc_Print( 1, "%3d : %9.6f\n", k, p->pPatCosts[k] );
    }

    // choose as many as there are words
    Vec_IntClear( vInits );
    for ( i = 0; i < p->pPars->nWords; i++ )
    {
        // select the best
        int iPatBest = -1;
        double iCostBest = -ABC_INFINITY;
        for ( k = 0; k < p->pPars->nWords * 64; k++ )
            if ( iCostBest < p->pPatCosts[k] )
            {
                iCostBest = p->pPatCosts[k];
                iPatBest  = k;
            }
        // remove from costs
        assert( iPatBest >= 0 );
        p->pPatCosts[iPatBest] = -ABC_INFINITY;
        // set the flops
        pPattern = (unsigned *)Ssw_RarPatSim( p, iPatBest );
        for ( k = 0; k < Aig_ManRegNum(p->pAig); k++ )
            Vec_IntPush( vInits, Abc_InfoHasBit(pPattern, k) );
//Abc_Print( 1, "Best pattern %5d\n", iPatBest );
        Vec_IntPush( p->vPatBests, iPatBest );
    }
    assert( Vec_IntSize(vInits) == Aig_ManRegNum(p->pAig) * p->pPars->nWords );
}